

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::DeleteBuckets(BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *this,int *buckets,uint bucketCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t byteSize;
  Type this_00;
  
  if (buckets == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x45a,"(buckets)","buckets");
    if (!bVar2) goto LAB_003f18b8;
    *puVar3 = 0;
  }
  if (bucketCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x45b,"(bucketCount != 0)","bucketCount != 0");
    if (!bVar2) {
LAB_003f18b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->alloc;
    byteSize = 0;
  }
  else {
    this_00 = this->alloc;
    if (bucketCount == 6) {
      *(BVSparseNode **)buckets = this_00->bvFreeList;
      this_00->bvFreeList = (BVSparseNode *)buckets;
      return;
    }
    byteSize = (ulong)bucketCount << 2;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,buckets,
             byteSize);
  return;
}

Assistant:

void DeleteBuckets(__in_ecount(bucketCount) int *const buckets, const uint bucketCount)
        {
            Assert(buckets);
            Assert(bucketCount != 0);

            AllocatorFree(alloc, (TypeAllocatorFunc<AllocatorType, int>::GetFreeFunc()), buckets, bucketCount * sizeof(int));
        }